

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_service.c
# Opt level: O0

MPP_RET mpp_service_set_info(void *ctx,MppDevInfoCfg *cfg)

{
  undefined8 *puVar1;
  MppDevMppService *p;
  MppDevInfoCfg *cfg_local;
  void *ctx_local;
  
  if (*(int *)((long)ctx + 0x188) != 0) {
    if (*(int *)((long)ctx + 0x78) == 0) {
      memset((void *)((long)ctx + 0x80),0,0x100);
    }
    puVar1 = (undefined8 *)((long)ctx + (long)*(int *)((long)ctx + 0x78) * 0x10 + 0x80);
    *puVar1 = *(undefined8 *)cfg;
    puVar1[1] = cfg->data;
    *(int *)((long)ctx + 0x78) = *(int *)((long)ctx + 0x78) + 1;
  }
  return MPP_OK;
}

Assistant:

MPP_RET mpp_service_set_info(void *ctx, MppDevInfoCfg *cfg)
{
    MppDevMppService *p = (MppDevMppService *)ctx;

    if (!p->support_set_info)
        return MPP_OK;

    if (!p->info_count)
        memset(p->info, 0, sizeof(p->info));

    memcpy(&p->info[p->info_count], cfg, sizeof(MppDevInfoCfg));
    p->info_count++;

    return MPP_OK;
}